

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

shared_ptr<chrono::ChBody> __thiscall
chrono::utils::CreateCylindricalContainerFromBoxes
          (utils *this,ChSystem *system,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChVector<double> *hdim,double hthick,int numBoxes,ChVector<double> *pos,
          ChQuaternion<double> *rot,bool collide,bool overlap,bool closed,bool isBoxBase,
          bool partialVisualization)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  ChBody *pCVar4;
  double __x;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  element_type *peVar13;
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ChSystem *pCVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  shared_ptr<chrono::ChBody> sVar25;
  ChQuaternion<double> local_1d8;
  double local_1b8;
  undefined8 uStack_1b0;
  ChVector<double> local_1a8;
  element_type *local_188;
  ChSystem *local_180;
  double local_178;
  double dStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_150;
  shared_ptr<chrono::ChVisualMaterial> local_148;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_128;
  shared_ptr<chrono::ChVisualMaterial> local_118;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_f8;
  ChVector<double> local_e8;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_d0;
  shared_ptr<chrono::ChVisualMaterial> local_c0;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_90;
  ChVector<double> p_boxSize;
  ChQuaternion<double> local_50;
  undefined1 extraout_var_00 [56];
  
  local_1b8 = hthick;
  uStack_1b0 = in_XMM0_Qb;
  iVar14 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  iVar15 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar14 != iVar15) {
    __assert_fail("mat->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,700,
                  "std::shared_ptr<ChBody> chrono::utils::CreateCylindricalContainerFromBoxes(ChSystem *, int, std::shared_ptr<ChMaterialSurface>, const ChVector<> &, double, int, const ChVector<> &, const ChQuaternion<> &, bool, bool, bool, bool, bool)"
                 );
  }
  iVar14 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                     (system);
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<chrono::ChBody,void>
            ((__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> *)this,
             (ChBody *)CONCAT44(extraout_var,iVar14));
  lVar3 = *(long *)this;
  *(int *)(lVar3 + 0x28) = id;
  if ((ChVector<double> *)(lVar3 + 0x80) != pos) {
    *(double *)(lVar3 + 0x80) = pos->m_data[0];
    *(double *)(lVar3 + 0x88) = pos->m_data[1];
    *(double *)(lVar3 + 0x90) = pos->m_data[2];
  }
  local_188 = (element_type *)this;
  ChFrame<double>::SetRot((ChFrame<double> *)(lVar3 + 0x78),rot);
  ChBody::SetCollide(*(ChBody **)this,collide);
  ChBody::SetBodyFixed(*(ChBody **)this,true);
  local_168 = hdim->m_data[0] + hdim->m_data[0];
  local_178 = (double)numBoxes;
  local_180 = system;
  dVar19 = tan(3.141592653589793 / local_178);
  p_boxSize.m_data[2] = (double)((ulong)overlap * (long)(local_1b8 + local_1b8)) + hdim->m_data[2];
  p_boxSize.m_data[0] = (dVar19 * local_168 + local_1b8) * 0.5;
  local_e8.m_data[2] = 0.0;
  p_boxSize.m_data[1] = local_1b8;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_50.m_data[0] = (double)QUNIT;
  local_50.m_data[1] = (double)_DAT_011dd298;
  local_50.m_data[2] = dRam00000000011dd2a0;
  local_50.m_data[3] = DAT_011dd2a8;
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1d8,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x198));
  (*(*(_func_int ***)local_1d8.m_data[0])[3])();
  local_150 = 6.283185307179586 / local_178;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8.m_data + 1));
  dVar19 = local_1b8;
  for (uVar17 = 0; peVar13 = local_188, (~(numBoxes >> 0x1f) & numBoxes) != uVar17;
      uVar17 = uVar17 + 1) {
    __x = (double)(int)uVar17 * local_150;
    local_168 = sin(__x);
    local_178 = hdim->m_data[0];
    dStack_170 = hdim->m_data[1];
    uStack_160 = extraout_XMM0_Qb;
    auVar22._0_8_ = cos(__x);
    auVar22._8_56_ = extraout_var_00;
    auVar10._8_8_ = dStack_170;
    auVar10._0_8_ = local_178;
    auVar11._8_8_ = uStack_160;
    auVar11._0_8_ = local_168;
    auVar23 = vmovhpd_avx(auVar10,hdim->m_data[0]);
    local_e8.m_data[2] = hdim->m_data[2] + pos->m_data[2];
    auVar18 = vunpcklpd_avx(auVar11,auVar22._0_16_);
    local_e8.m_data[0] = auVar18._0_8_ * (auVar23._0_8_ + dVar19) + pos->m_data[0];
    local_e8.m_data[1] = auVar18._8_8_ * (auVar23._8_8_ + dVar19) + pos->m_data[1];
    local_1a8.m_data[0] = 0.0;
    local_1a8.m_data[1] = 0.0;
    local_1a8.m_data[2] = __x;
    Angle_to_Quat(&local_1d8,RXYZ,&local_1a8);
    pCVar4 = (ChBody *)(local_188->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    local_50.m_data[0] = local_1d8.m_data[0];
    local_50.m_data[1] = local_1d8.m_data[1];
    local_50.m_data[2] = local_1d8.m_data[2];
    local_50.m_data[3] = local_1d8.m_data[3];
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,
               &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,(shared_ptr<chrono::ChMaterialSurface> *)&local_90,&p_boxSize,&local_e8,
                   &local_50,
                   (4.71238898038469 <= __x || !partialVisualization) || __x <= 3.141592653589793,
                   &local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  }
  pCVar4 = (ChBody *)(local_188->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
  if (isBoxBase) {
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f8,
               &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    auVar6._8_8_ = uStack_1b0;
    auVar6._0_8_ = local_1b8;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar18 = vxorpd_avx512vl(auVar6,auVar5);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = hdim->m_data[0];
    auVar23 = vfmadd231sd_fma(auVar20,auVar6,ZEXT816(0x4000000000000000));
    local_1d8.m_data[0] = auVar23._0_8_;
    local_1d8.m_data[2] = local_1b8;
    local_1a8.m_data[0] = 0.0;
    local_1a8.m_data[1] = 0.0;
    local_1a8.m_data[2] = (double)vmovlpd_avx(auVar18);
    local_1d8.m_data[1] = local_1d8.m_data[0];
    ChVisualMaterial::Default();
    pCVar16 = local_180;
    AddBoxGeometry(pCVar4,(shared_ptr<chrono::ChMaterialSurface> *)&local_f8,
                   (ChVector<double> *)&local_1d8,&local_1a8,(ChQuaternion<double> *)&QUNIT,true,
                   &local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
    if (!closed) goto LAB_00e36388;
    pCVar4 = (ChBody *)(peVar13->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_128,
               &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    auVar7._8_8_ = uStack_1b0;
    auVar7._0_8_ = local_1b8;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = hdim->m_data[0];
    auVar23 = vfmadd231sd_fma(auVar21,auVar7,ZEXT816(0x4000000000000000));
    local_1d8.m_data[0] = auVar23._0_8_;
    local_1d8.m_data[2] = local_1b8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = hdim->m_data[2];
    auVar23 = vfmadd132sd_fma(ZEXT816(0x4000000000000000),auVar7,auVar1);
    local_1a8.m_data[0] = 0.0;
    local_1a8.m_data[1] = 0.0;
    local_1a8.m_data[2] = auVar23._0_8_;
    local_1d8.m_data[1] = local_1d8.m_data[0];
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar4,(shared_ptr<chrono::ChMaterialSurface> *)&local_128,
                   (ChVector<double> *)&local_1d8,&local_1a8,(ChQuaternion<double> *)&QUNIT,true,
                   &local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var12 = &local_128;
  }
  else {
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,
               &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    auVar8._8_8_ = uStack_1b0;
    auVar8._0_8_ = local_1b8;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = hdim->m_data[0];
    auVar23 = vfmadd231sd_fma(auVar23,auVar8,ZEXT816(0x4000000000000000));
    auVar18._8_8_ = 0x8000000000000000;
    auVar18._0_8_ = 0x8000000000000000;
    auVar18 = vxorpd_avx512vl(auVar8,auVar18);
    local_1a8.m_data[0] = 0.0;
    local_1a8.m_data[1] = 0.0;
    local_1a8.m_data[2] = (double)vmovlpd_avx(auVar18);
    Q_from_AngAxis(&local_1d8,1.5707963267948966,(ChVector<double> *)&VECT_X);
    pCVar16 = local_180;
    ChVisualMaterial::Default();
    AddCylinderGeometry(pCVar4,(shared_ptr<chrono::ChMaterialSurface> *)&local_108,auVar23._0_8_,
                        local_1b8,&local_1a8,&local_1d8,true,&local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_118.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    if (!closed) goto LAB_00e36388;
    pCVar4 = (ChBody *)(peVar13->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,
               &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    auVar9._8_8_ = uStack_1b0;
    auVar9._0_8_ = local_1b8;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = hdim->m_data[0];
    auVar18 = vfmadd231sd_fma(auVar24,auVar9,ZEXT816(0x4000000000000000));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = hdim->m_data[2];
    auVar23 = vfmadd132sd_fma(ZEXT816(0x4000000000000000),auVar9,auVar2);
    local_1a8.m_data[0] = 0.0;
    local_1a8.m_data[1] = 0.0;
    local_1a8.m_data[2] = auVar23._0_8_;
    Q_from_AngAxis(&local_1d8,1.5707963267948966,(ChVector<double> *)&VECT_X);
    ChVisualMaterial::Default();
    AddCylinderGeometry(pCVar4,(shared_ptr<chrono::ChMaterialSurface> *)&local_138,auVar18._0_8_,
                        local_1b8,&local_1a8,&local_1d8,true,&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_148.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var12 = &local_138;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var12->_M_refcount);
LAB_00e36388:
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1d8,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((peVar13->super_ChPhysicsItem).super_ChObj._vptr_ChObj + 0x33));
  (*(*(_func_int ***)local_1d8.m_data[0])[0x24])(local_1b8 * 0.2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8.m_data + 1));
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1d8,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((peVar13->super_ChPhysicsItem).super_ChObj._vptr_ChObj + 0x33));
  (*(*(_func_int ***)local_1d8.m_data[0])[4])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8.m_data + 1));
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d0,(__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)peVar13);
  (*(pCVar16->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
            (pCVar16,&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  sVar25.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar25.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar13;
  return (shared_ptr<chrono::ChBody>)
         sVar25.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> CreateCylindricalContainerFromBoxes(ChSystem* system,
                                                            int id,
                                                            std::shared_ptr<ChMaterialSurface> mat,
                                                            const ChVector<>& hdim,
                                                            double hthick,
                                                            int numBoxes,
                                                            const ChVector<>& pos,
                                                            const ChQuaternion<>& rot,
                                                            bool collide,
                                                            bool overlap,
                                                            bool closed,
                                                            bool isBoxBase,
                                                            bool partialVisualization) {
    // Verify consistency of input arguments.
    assert(mat->GetContactMethod() == system->GetContactMethod());

    // Create the body and set material
    std::shared_ptr<ChBody> body(system->NewBody());

    // Set body properties and geometry.
    body->SetIdentifier(id);
    // body->SetMass(1);
    body->SetPos(pos);
    body->SetRot(rot);
    body->SetCollide(collide);
    body->SetBodyFixed(true);

    double box_side = hdim.x() * 2.0 * tan(CH_C_PI / numBoxes);  // side length of cyl
    double o_lap = 0;
    if (overlap) {
        o_lap = hthick * 2;
    }
    double ang = 2.0 * CH_C_PI / numBoxes;
    ChVector<> p_boxSize = ChVector<>((box_side + hthick) / 2.0, hthick, hdim.z() + o_lap);  // size of plates
    ChVector<> p_pos;                                                                        // position of each plate
    ChQuaternion<> p_quat = QUNIT;                                                           // rotation of each plate
    body->GetCollisionModel()->ClearModel();

    for (int i = 0; i < numBoxes; i++) {
        p_pos = pos + ChVector<>(sin(ang * i) * (hthick + hdim.x()), cos(ang * i) * (hthick + hdim.x()), hdim.z());

        p_quat = Angle_to_Quat(AngleSet::RXYZ, ChVector<>(0, 0, ang * i));

        // this is here to make half the cylinder invisible.
        bool m_visualization = true;
        if ((ang * i > CH_C_PI && ang * i < 3.0 * CH_C_PI / 2.0) && partialVisualization) {
            m_visualization = false;
        }
        utils::AddBoxGeometry(body.get(), mat, p_boxSize, p_pos, p_quat, m_visualization);
    }

    // Add ground piece
    if (isBoxBase) {
        utils::AddBoxGeometry(body.get(), mat, Vector(hdim.x() + 2 * hthick, hdim.x() + 2 * hthick, hthick),
                              Vector(0, 0, -hthick), QUNIT, true);
    } else {
        utils::AddCylinderGeometry(body.get(), mat, hdim.x() + 2 * hthick, hthick, ChVector<>(0, 0, -hthick),
                                   Q_from_AngAxis(CH_C_PI / 2, VECT_X));
    }

    if (closed) {
        if (isBoxBase) {
            utils::AddBoxGeometry(body.get(), mat, Vector(hdim.x() + 2 * hthick, hdim.x() + 2 * hthick, hthick),
                                  Vector(0, 0, 2 * hdim.z() + hthick), QUNIT, true);
        } else {
            utils::AddCylinderGeometry(body.get(), mat, hdim.x() + 2 * hthick, hthick,
                                       ChVector<>(0, 0, 2 * hdim.z() + hthick), Q_from_AngAxis(CH_C_PI / 2, VECT_X));
        }
    }

    body->GetCollisionModel()->SetEnvelope(0.2 * hthick);
    body->GetCollisionModel()->BuildModel();

    system->AddBody(body);
    return body;
}